

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

int secp256k1_musig_pubkey_tweak_add_internal
              (secp256k1_context *ctx,secp256k1_pubkey *output_pubkey,
              secp256k1_musig_keyagg_cache *keyagg_cache,uchar *tweak32,int xonly)

{
  int iVar1;
  int overflow;
  secp256k1_scalar tweak;
  secp256k1_ge_storage s;
  int local_18c;
  secp256k1_scalar local_188;
  secp256k1_keyagg_cache_internal local_168;
  secp256k1_ge_storage local_70;
  
  local_18c = 0;
  if (output_pubkey != (secp256k1_pubkey *)0x0) {
    output_pubkey->data[0x30] = '\0';
    output_pubkey->data[0x31] = '\0';
    output_pubkey->data[0x32] = '\0';
    output_pubkey->data[0x33] = '\0';
    output_pubkey->data[0x34] = '\0';
    output_pubkey->data[0x35] = '\0';
    output_pubkey->data[0x36] = '\0';
    output_pubkey->data[0x37] = '\0';
    output_pubkey->data[0x38] = '\0';
    output_pubkey->data[0x39] = '\0';
    output_pubkey->data[0x3a] = '\0';
    output_pubkey->data[0x3b] = '\0';
    output_pubkey->data[0x3c] = '\0';
    output_pubkey->data[0x3d] = '\0';
    output_pubkey->data[0x3e] = '\0';
    output_pubkey->data[0x3f] = '\0';
    output_pubkey->data[0x20] = '\0';
    output_pubkey->data[0x21] = '\0';
    output_pubkey->data[0x22] = '\0';
    output_pubkey->data[0x23] = '\0';
    output_pubkey->data[0x24] = '\0';
    output_pubkey->data[0x25] = '\0';
    output_pubkey->data[0x26] = '\0';
    output_pubkey->data[0x27] = '\0';
    output_pubkey->data[0x28] = '\0';
    output_pubkey->data[0x29] = '\0';
    output_pubkey->data[0x2a] = '\0';
    output_pubkey->data[0x2b] = '\0';
    output_pubkey->data[0x2c] = '\0';
    output_pubkey->data[0x2d] = '\0';
    output_pubkey->data[0x2e] = '\0';
    output_pubkey->data[0x2f] = '\0';
    output_pubkey->data[0x10] = '\0';
    output_pubkey->data[0x11] = '\0';
    output_pubkey->data[0x12] = '\0';
    output_pubkey->data[0x13] = '\0';
    output_pubkey->data[0x14] = '\0';
    output_pubkey->data[0x15] = '\0';
    output_pubkey->data[0x16] = '\0';
    output_pubkey->data[0x17] = '\0';
    output_pubkey->data[0x18] = '\0';
    output_pubkey->data[0x19] = '\0';
    output_pubkey->data[0x1a] = '\0';
    output_pubkey->data[0x1b] = '\0';
    output_pubkey->data[0x1c] = '\0';
    output_pubkey->data[0x1d] = '\0';
    output_pubkey->data[0x1e] = '\0';
    output_pubkey->data[0x1f] = '\0';
    output_pubkey->data[0] = '\0';
    output_pubkey->data[1] = '\0';
    output_pubkey->data[2] = '\0';
    output_pubkey->data[3] = '\0';
    output_pubkey->data[4] = '\0';
    output_pubkey->data[5] = '\0';
    output_pubkey->data[6] = '\0';
    output_pubkey->data[7] = '\0';
    output_pubkey->data[8] = '\0';
    output_pubkey->data[9] = '\0';
    output_pubkey->data[10] = '\0';
    output_pubkey->data[0xb] = '\0';
    output_pubkey->data[0xc] = '\0';
    output_pubkey->data[0xd] = '\0';
    output_pubkey->data[0xe] = '\0';
    output_pubkey->data[0xf] = '\0';
  }
  if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
    secp256k1_musig_pubkey_tweak_add_internal_cold_2();
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      iVar1 = secp256k1_keyagg_cache_load(ctx,&local_168,keyagg_cache);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_188,tweak32,&local_18c);
      if (local_18c != 0) {
        return 0;
      }
      if ((xonly != 0) && ((local_168.pk.y.n[0] & 1) != 0)) {
        local_168.pk.y.n[0] = 0x3ffffbfffff0bc - local_168.pk.y.n[0];
        local_168.pk.y.n[1] = 0x3ffffffffffffc - local_168.pk.y.n[1];
        local_168.pk.y.n[2] = 0x3ffffffffffffc - local_168.pk.y.n[2];
        local_168.pk.y.n[3] = 0x3ffffffffffffc - local_168.pk.y.n[3];
        local_168.pk.y.n[4] = 0x3fffffffffffc - local_168.pk.y.n[4];
        local_168.parity_acc._0_1_ = (byte)local_168.parity_acc ^ 1;
        secp256k1_scalar_negate(&local_168.tweak,&local_168.tweak);
      }
      secp256k1_scalar_add(&local_168.tweak,&local_168.tweak,&local_188);
      iVar1 = secp256k1_eckey_pubkey_tweak_add(&local_168.pk,&local_188);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_keyagg_cache_save(keyagg_cache,&local_168);
      if (output_pubkey == (secp256k1_pubkey *)0x0) {
        return 1;
      }
      secp256k1_ge_to_storage(&local_70,&local_168.pk);
      *(uint64_t *)(output_pubkey->data + 0x30) = local_70.y.n[2];
      *(uint64_t *)(output_pubkey->data + 0x38) = local_70.y.n[3];
      *(uint64_t *)(output_pubkey->data + 0x20) = local_70.y.n[0];
      *(uint64_t *)(output_pubkey->data + 0x28) = local_70.y.n[1];
      *(uint64_t *)(output_pubkey->data + 0x10) = local_70.x.n[2];
      *(uint64_t *)(output_pubkey->data + 0x18) = local_70.x.n[3];
      *(uint64_t *)output_pubkey->data = local_70.x.n[0];
      *(uint64_t *)(output_pubkey->data + 8) = local_70.x.n[1];
      return 1;
    }
    secp256k1_musig_pubkey_tweak_add_internal_cold_1();
  }
  return 0;
}

Assistant:

static int secp256k1_musig_pubkey_tweak_add_internal(const secp256k1_context* ctx, secp256k1_pubkey *output_pubkey, secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *tweak32, int xonly) {
    secp256k1_keyagg_cache_internal cache_i;
    int overflow = 0;
    secp256k1_scalar tweak;

    VERIFY_CHECK(ctx != NULL);
    if (output_pubkey != NULL) {
        memset(output_pubkey, 0, sizeof(*output_pubkey));
    }
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&tweak, tweak32, &overflow);
    if (overflow) {
        return 0;
    }
    if (xonly && secp256k1_extrakeys_ge_even_y(&cache_i.pk)) {
        cache_i.parity_acc ^= 1;
        secp256k1_scalar_negate(&cache_i.tweak, &cache_i.tweak);
    }
    secp256k1_scalar_add(&cache_i.tweak, &cache_i.tweak, &tweak);
    if (!secp256k1_eckey_pubkey_tweak_add(&cache_i.pk, &tweak)) {
        return 0;
    }
    /* eckey_pubkey_tweak_add fails if cache_i.pk is infinity */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&cache_i.pk));
    secp256k1_keyagg_cache_save(keyagg_cache, &cache_i);
    if (output_pubkey != NULL) {
        secp256k1_pubkey_save(output_pubkey, &cache_i.pk);
    }
    return 1;
}